

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_volume_status(REF_GRID ref_grid)

{
  REF_MPI ref_mpi_00;
  REF_STATUS RVar1;
  uint uVar2;
  double local_d8;
  double local_d0;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL volume;
  REF_DBL max_volume;
  REF_DBL min_volume;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  ref_mpi_00 = ref_grid->mpi;
  unique0x00012000 = ref_grid->cell[8];
  max_volume = 1e+200;
  volume = -1e+200;
  nodes[0x19] = 0;
  do {
    if (stack0xffffffffffffffd8->max <= nodes[0x19]) {
      _ref_private_macro_code_rss_1 = max_volume;
      ref_grid_local._4_4_ = ref_mpi_min(ref_mpi_00,&ref_private_macro_code_rss_1,&max_volume,3);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&max_volume,1,3);
        if (ref_grid_local._4_4_ == 0) {
          _ref_private_macro_code_rss_1 = volume;
          ref_grid_local._4_4_ = ref_mpi_max(ref_mpi_00,&ref_private_macro_code_rss_1,&volume,3);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&volume,1,3);
            if (ref_grid_local._4_4_ == 0) {
              if (ref_grid->mpi->id == 0) {
                printf("volume %.5e %.5e\n",max_volume,volume);
              }
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x1eb,"ref_validation_volume_status",(ulong)ref_grid_local._4_4_,"min");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x1ea,"ref_validation_volume_status",(ulong)ref_grid_local._4_4_,"mpi max");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x1e8,"ref_validation_volume_status",(ulong)ref_grid_local._4_4_,"min");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x1e7,"ref_validation_volume_status",(ulong)ref_grid_local._4_4_,"mpi min");
      }
      return ref_grid_local._4_4_;
    }
    RVar1 = ref_cell_nodes(stack0xffffffffffffffd8,nodes[0x19],(REF_INT *)&min_volume);
    if (RVar1 == 0) {
      uVar2 = ref_node_tet_vol(ref_grid->node,(REF_INT *)&min_volume,
                               (REF_DBL *)&ref_private_macro_code_rss_1);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x1e2,"ref_validation_volume_status",(ulong)uVar2,"vol");
        return uVar2;
      }
      if (_ref_private_macro_code_rss_1 <= max_volume) {
        local_d0 = _ref_private_macro_code_rss_1;
      }
      else {
        local_d0 = max_volume;
      }
      max_volume = local_d0;
      if (volume <= _ref_private_macro_code_rss_1) {
        local_d8 = _ref_private_macro_code_rss_1;
      }
      else {
        local_d8 = volume;
      }
      volume = local_d8;
    }
    nodes[0x19] = nodes[0x19] + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_volume_status(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL min_volume, max_volume;
  REF_DBL volume;

  min_volume = REF_DBL_MAX;
  max_volume = REF_DBL_MIN;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tet_vol(ref_grid_node(ref_grid), nodes, &volume), "vol");
    min_volume = MIN(min_volume, volume);
    max_volume = MAX(max_volume, volume);
  }
  volume = min_volume;
  RSS(ref_mpi_min(ref_mpi, &volume, &min_volume, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_volume, 1, REF_DBL_TYPE), "min");
  volume = max_volume;
  RSS(ref_mpi_max(ref_mpi, &volume, &max_volume, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_volume, 1, REF_DBL_TYPE), "min");

  if (ref_grid_once(ref_grid))
    printf("volume %.5e %.5e\n", min_volume, max_volume);

  return REF_SUCCESS;
}